

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

OperatingState __thiscall helics::CommonCore::minFederateState(CommonCore *this)

{
  bool bVar1;
  BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> *this_00;
  long in_RDI;
  FedInfo *fed;
  const_iterator __end1;
  const_iterator __begin1;
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
  *__range1;
  OperatingState state;
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
  *in_stack_ffffffffffffffb0;
  BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> local_48;
  BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> local_30;
  long local_18;
  OperatingState local_9;
  
  local_9 = DISCONNECTED;
  local_18 = in_RDI + 0x470;
  gmlc::containers::
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::
  begin(in_stack_ffffffffffffffb0);
  gmlc::containers::
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::end
            (in_stack_ffffffffffffffb0);
  while( true ) {
    bVar1 = gmlc::containers::
            BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>::operator!=
                      (&local_30,&local_48);
    if (!bVar1) break;
    this_00 = (BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> *)
              gmlc::containers::
              BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>::operator*
                        (&local_30);
    if (*(OperatingState *)&this_00->ptr < local_9) {
      local_9 = *(OperatingState *)&this_00->ptr;
    }
    gmlc::containers::BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>::
    operator++(this_00);
  }
  return local_9;
}

Assistant:

OperatingState CommonCore::minFederateState() const
{
    OperatingState state{OperatingState::DISCONNECTED};
    for (const auto& fed : loopFederates) {
        if (fed.state < state) {
            state = fed.state;
        }
    }
    return state;
}